

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::applyExtraConfigs(QMakeEvaluator *this)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QString local_d0;
  QString local_b8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  QStringBuilder<QString,_QString> local_78;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_extraConfigs).super_QList<ProString>.d.size != 0) {
    QVar1.m_data = (storage_type *)0xa;
    QVar1.m_size = (qsizetype)&local_98;
    QString::fromLatin1(QVar1);
    ProStringList::join(&local_b8,&this->m_extraConfigs,(QChar)0x20);
    local_78.a.d.size = local_88;
    local_78.a.d.ptr = pcStack_90;
    local_78.a.d.d = (Data *)local_98;
    local_78.b.d.size = local_b8.d.size;
    local_78.b.d.ptr = local_b8.d.ptr;
    local_78.b.d.d = local_b8.d.d;
    local_98 = (QArrayData *)0x0;
    pcStack_90 = (char16_t *)0x0;
    local_88 = 0;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_40,&local_78);
    QVar2.m_data = (storage_type *)0xf;
    QVar2.m_size = (qsizetype)&local_d0;
    QString::fromLatin1(QVar2);
    evaluateCommand(this,&local_40,&local_d0);
    if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_78);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::applyExtraConfigs()
{
    if (m_extraConfigs.isEmpty())
        return;

    evaluateCommand(fL1S("CONFIG += ") + m_extraConfigs.join(QLatin1Char(' ')), fL1S("(extra configs)"));
}